

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O3

QWidget * __thiscall
QItemEditorFactory::createEditor(QItemEditorFactory *this,int userType,QWidget *parent)

{
  Data<QHashPrivate::Node<int,_QItemEditorCreatorBase_*>_> *this_00;
  QItemEditorCreatorBase *pQVar1;
  int iVar2;
  Node<int,_QItemEditorCreatorBase_*> *pNVar3;
  undefined4 extraout_var;
  QItemEditorFactory *pQVar5;
  undefined4 extraout_var_00;
  long in_FS_OFFSET;
  uint local_1c;
  long local_18;
  QWidget *pQVar4;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->creatorMap).d;
  local_1c = userType;
  if (this_00 != (Data<QHashPrivate::Node<int,_QItemEditorCreatorBase_*>_> *)0x0) {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<int,_QItemEditorCreatorBase_*>_>::findNode<int>
                       (this_00,(int *)&local_1c);
    if ((pNVar3 != (Node<int,_QItemEditorCreatorBase_*> *)0x0) &&
       (pQVar1 = pNVar3->value, pQVar1 != (QItemEditorCreatorBase *)0x0)) {
      iVar2 = (*pQVar1->_vptr_QItemEditorCreatorBase[2])(pQVar1,parent);
      pQVar4 = (QWidget *)CONCAT44(extraout_var,iVar2);
      goto LAB_0055b161;
    }
  }
  pQVar5 = defaultFactory();
  if (pQVar5 == this) {
    pQVar4 = (QWidget *)0x0;
  }
  else {
    iVar2 = (*pQVar5->_vptr_QItemEditorFactory[2])(pQVar5,(ulong)local_1c,parent);
    pQVar4 = (QWidget *)CONCAT44(extraout_var_00,iVar2);
  }
LAB_0055b161:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QItemEditorFactory::createEditor(int userType, QWidget *parent) const
{
    QItemEditorCreatorBase *creator = creatorMap.value(userType, 0);
    if (!creator) {
        const QItemEditorFactory *dfactory = defaultFactory();
        return dfactory == this ? nullptr : dfactory->createEditor(userType, parent);
    }
    return creator->createWidget(parent);
}